

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.h
# Opt level: O2

void __thiscall absl::lts_20250127::BadStatusOrAccess::~BadStatusOrAccess(BadStatusOrAccess *this)

{
  *(undefined ***)this = &PTR__BadStatusOrAccess_0079f448;
  std::__cxx11::string::~string((string *)&this->what_);
  Status::~Status(&this->status_);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

~BadStatusOrAccess() override = default;